

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O3

bool __thiscall ON_Buffer::ReadFromBinaryArchive(ON_Buffer *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  ON__UINT32 OVar3;
  ON__UINT64 OVar4;
  void *p;
  int iVar5;
  ulong count;
  ulong uVar6;
  ON__UINT64 saved_buffer_size;
  ON__UINT32 saved_buffer_crc;
  int minor_version;
  int major_version;
  ON__UINT64 local_78;
  ON__UINT32 local_6c;
  int local_68;
  int local_64;
  size_t local_60;
  ON_3DM_BIG_CHUNK local_58;
  
  ChangeSize(this,0);
  local_64 = 0;
  local_68 = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x28100,&local_64,&local_68);
  if (!bVar1) {
    return false;
  }
  local_58.m_big_value = 0;
  local_58.m_typecode = 0;
  local_58.m_bLongChunk = '\0';
  local_58.m_reserved1 = '\0';
  local_58.m_reserved2 = '\0';
  local_58.m_reserved3 = '\0';
  local_58.m_start_offset = 0;
  local_58.m_end_offset = 0;
  local_58.m_do_crc16 = '\0';
  local_58.m_do_crc32 = '\0';
  local_58.m_crc16 = 0;
  local_58.m_crc32 = 0;
  ON_BinaryArchive::GetCurrentChunk(archive,&local_58);
  local_78 = 0;
  local_6c = 0;
  if (((local_64 == 1) && (bVar1 = ON_BinaryArchive::ReadBigInt(archive,&local_78), bVar1)) &&
     (bVar1 = ON_BinaryArchive::ReadInt(archive,&local_6c), iVar5 = local_68, bVar1)) {
    OVar4 = ON_3DM_BIG_CHUNK::Length(&local_58);
    if (iVar5 == 0) {
      iVar5 = 0x51b;
      if (OVar4 != local_78 + 0x18) goto LAB_0045b1d6;
    }
    else {
      iVar5 = 0x524;
      if (OVar4 < local_78 + 0x18) {
LAB_0045b1d6:
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                   ,iVar5,"","corrupt archive");
        goto LAB_0045b1f2;
      }
    }
    if (local_78 == 0) {
      bVar1 = true;
    }
    else {
      local_60 = 0x10000;
      if (local_78 < 0x10000) {
        local_60 = local_78;
      }
      p = onmalloc(local_60);
      if (p == (void *)0x0) goto LAB_0045b1f2;
      if (local_78 == 0) {
        bVar1 = true;
      }
      else {
        uVar6 = 0;
        do {
          count = local_78 - uVar6;
          if (local_60 < local_78 - uVar6) {
            count = local_60;
          }
          bVar1 = ON_BinaryArchive::ReadByte(archive,count,p);
          if (!bVar1) break;
          Write(this,count,p);
          uVar6 = uVar6 + count;
        } while (uVar6 < local_78);
      }
      onfree(p);
    }
    bVar2 = ON_BinaryArchive::EndRead3dmChunk(archive);
    if ((bVar2) && (bVar1 != false)) {
      Compact(this);
      OVar3 = CRC32(this,0);
      if ((OVar3 == local_6c) && (this->m_buffer_size == local_78)) {
        return true;
      }
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                 ,0x556,"","The buffer contents were corrupted during, writing, storage or reading."
                );
      return true;
    }
  }
  else {
LAB_0045b1f2:
    ON_BinaryArchive::EndRead3dmChunk(archive);
  }
  ChangeSize(this,0);
  return false;
}

Assistant:

bool ON_Buffer::ReadFromBinaryArchive( ON_BinaryArchive& archive )
{
  Destroy();
  
  int major_version = 0;
  int minor_version = 0;
  if ( !archive.BeginRead3dmChunk(TCODE_OPENNURBS_BUFFER,&major_version,&minor_version) )
    return false;

  ON_3DM_BIG_CHUNK c0;
  memset(&c0,0,sizeof(c0));
  archive.GetCurrentChunk(c0);

  ON__UINT64 saved_buffer_size = 0;
  ON__UINT32 saved_buffer_crc = 0;
  bool rc = false;
  void* a = 0;
  for(;;)
  {
    if ( 1 != major_version )
      break;
    
    if ( !archive.ReadBigInt(&saved_buffer_size) )
      break;

    if ( !archive.ReadInt(&saved_buffer_crc) )
      break;

    const ON__UINT64 extra_size = 24; // =
                                      //  4  ( major version number )
                                      // +4  ( minor version number )
                                      // +8  ( 64-bit buffer_size )
                                      // +4  ( 32-bit buffer_crc )
                                      // +4  ( 32-bit chunk crc )
    if ( 0 == minor_version )
    {
      if ( c0.Length() != extra_size + saved_buffer_size )
      {
        ON_ERROR("corrupt archive");
        break;
      }
    }
    else if ( c0.Length() < extra_size + saved_buffer_size )
    {
      // later versions may add more information
      // but there still needs to be enough room
      // to store the buffer.
      ON_ERROR("corrupt archive");
      break;
    }

    if ( saved_buffer_size > 0 )
    {
      ON__UINT64 a_capacity = saved_buffer_size;
      if ( a_capacity > 16*4096 )
        a_capacity = 16*4096;
      a = onmalloc((size_t)a_capacity);
      if ( 0 == a )
        break;
      ON__UINT64 size = 0;
      bool buffer_rc = true;
      while( size < saved_buffer_size )
      {
        ON__UINT64 read_size = a_capacity;
        if ( read_size > saved_buffer_size - size )
          read_size = saved_buffer_size - size;
        if ( !archive.ReadByte((size_t)read_size,a) )
        {
          buffer_rc = false;
          break;
        }
        // add to buffer
        Write(read_size,a);
        size += read_size;
      }
    
      if ( !buffer_rc )
        break;
    }

    rc = true;
    break;
  }

  if ( 0 != a )
    onfree(a);

  if ( !archive.EndRead3dmChunk() )
    rc = false;

  if ( rc )
  {
    Compact();
    const ON__UINT32 buffer_crc = CRC32(0);
    if ( buffer_crc != saved_buffer_crc || m_buffer_size != saved_buffer_size)
    {
      // The buffer's contents have been damaged.
      ON_ERROR("The buffer contents were corrupted during, writing, storage or reading.");
    }
  }
  else
  {
    Destroy();
  }

  return rc;
}